

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void flatbuffers::(anonymous_namespace)::
     SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__3,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
               (Offset<flatbuffers::Table> *begin,Offset<flatbuffers::Table> *end,size_t width,
               anon_class_8_1_ba1d59bf comparator,
               _func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *swapper)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ushort *puVar7;
  int *piVar8;
  uint *puVar9;
  ushort uVar10;
  uint *puVar11;
  ushort uVar12;
  Offset<flatbuffers::Table> *a;
  Offset<flatbuffers::Table> *b;
  
  while (4 < (long)end - (long)begin) {
    a = begin + 1;
    b = end;
    while (a < b) {
      uVar1 = *(ushort *)(width + 0x108);
      uVar6 = (ulong)begin->o;
      puVar7 = (ushort *)((long)begin + (uVar6 - (long)*(int *)((long)&begin->o + uVar6)));
      if (uVar1 < *puVar7) {
        uVar10 = *(ushort *)((long)puVar7 + (ulong)uVar1);
      }
      else {
        uVar10 = 0;
      }
      piVar8 = (int *)((long)&a->o + (ulong)a->o);
      uVar12 = 0;
      puVar11 = (uint *)0x0;
      if (uVar10 != 0) {
        puVar11 = (uint *)((long)&begin->o + uVar10 + uVar6);
      }
      swapper = (_func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *)
                -(long)*piVar8;
      if (uVar1 < *(ushort *)((long)piVar8 + (long)swapper)) {
        uVar12 = *(ushort *)((long)piVar8 + ((ulong)uVar1 - (long)*piVar8));
      }
      puVar9 = (uint *)((long)piVar8 + (ulong)uVar12);
      if (uVar12 == 0) {
        puVar9 = (uint *)0x0;
      }
      comparator.key = (FieldDef *)(ulong)CONCAT11((char)(uVar12 >> 8),puVar11 != (uint *)0x0);
      if ((puVar11 != (uint *)0x0) && (puVar9 != (uint *)0x0)) {
        uVar2 = *(uint *)((long)puVar11 + (ulong)*puVar11);
        uVar3 = *(uint *)((ulong)*puVar9 + (long)puVar9);
        uVar4 = uVar2;
        if (uVar3 < uVar2) {
          uVar4 = uVar3;
        }
        iVar5 = memcmp((uint *)((long)puVar11 + (ulong)*puVar11) + 1,
                       (uint *)((ulong)*puVar9 + (long)puVar9) + 1,(ulong)uVar4);
        comparator.key = (FieldDef *)(ulong)(iVar5 < 0);
        if (iVar5 == 0) {
          comparator.key = (FieldDef *)(ulong)(uVar2 < uVar3);
        }
      }
      if ((char)comparator.key == '\0') {
        a = a + 1;
      }
      else {
        b = b + -1;
        anon_unknown_0::SwapSerializedTables(a,b);
      }
    }
    anon_unknown_0::SwapSerializedTables(begin,a + -1);
    SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__3,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
              (begin,a + -1,width,comparator,swapper);
    begin = b;
  }
  return;
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}